

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall QWidgetPrivate::resolveFont(QWidgetPrivate *this)

{
  QFont *this_00;
  char cVar1;
  long in_FS_OFFSET;
  QFont localfont;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 local_48 [24];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  naturalWidgetFont((QWidgetPrivate *)local_48,(uint)this);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = &(this->data).fnt;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  QFont::QFont((QFont *)&local_68,this_00);
  puStack_60 = (undefined1 *)CONCAT44(puStack_60._4_4_,this->directFontResolveMask);
  QFont::resolve((QFont *)&local_58);
  QFont::~QFont((QFont *)&local_68);
  if (this->directFontResolveMask == (uint)puStack_50) {
    cVar1 = QFont::operator==(this_00,(QFont *)&local_58);
    if (cVar1 != '\0') goto LAB_003022ab;
  }
  updateFont(this,(QFont *)&local_58);
LAB_003022ab:
  QFont::~QFont((QFont *)&local_58);
  QFont::~QFont((QFont *)local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::resolveFont()
{
    QFont naturalFont = naturalWidgetFont(inheritedFontResolveMask);
    QFont resolvedFont = localFont().resolve(naturalFont);
    setFont_helper(resolvedFont);
}